

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O1

void * dlrealloc(void *oldmem,size_t bytes)

{
  int *piVar1;
  mchunkptr pmVar2;
  void *pvVar3;
  int in_ECX;
  ulong __n;
  
  if (oldmem == (void *)0x0) {
    pvVar3 = dlmalloc(bytes);
    return pvVar3;
  }
  if (bytes < 0xffffffffffffff80) {
    pmVar2 = (mchunkptr)&DAT_00000020;
    if (0x16 < bytes) {
      pmVar2 = (mchunkptr)(bytes + 0x17 & 0xfffffffffffffff0);
    }
    pmVar2 = try_realloc_chunk((mstate)((long)oldmem + -0x10),pmVar2,1,in_ECX);
    if (pmVar2 != (mchunkptr)0x0) {
      return &pmVar2->fd;
    }
    pvVar3 = dlmalloc(bytes);
    if (pvVar3 != (void *)0x0) {
      __n = ((ulong)((*(ulong *)((long)oldmem + -8) & 3) != 0) << 3 | 0xfffffffffffffff0) +
            (*(ulong *)((long)oldmem + -8) & 0xfffffffffffffff8);
      if (bytes <= __n) {
        __n = bytes;
      }
      memcpy(pvVar3,oldmem,__n);
      dlfree(oldmem);
      return pvVar3;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return (void *)0x0;
}

Assistant:

void* dlrealloc(void* oldmem, size_t bytes) {
  void* mem = 0;
  if (oldmem == 0) {
    mem = dlmalloc(bytes);
  }
  else if (bytes >= MAX_REQUEST) {
    MALLOC_FAILURE_ACTION;
  }
#ifdef REALLOC_ZERO_BYTES_FREES
  else if (bytes == 0) {
    dlfree(oldmem);
  }
#endif /* REALLOC_ZERO_BYTES_FREES */
  else {
    size_t nb = request2size(bytes);
    mchunkptr oldp = mem2chunk(oldmem);
#if ! FOOTERS
    mstate m = gm;
#else /* FOOTERS */
    mstate m = get_mstate_for(oldp);
    if (!ok_magic(m)) {
      USAGE_ERROR_ACTION(m, oldmem);
      return 0;
    }
#endif /* FOOTERS */
    if (!PREACTION(m)) {
      mchunkptr newp = try_realloc_chunk(m, oldp, nb, 1);
      POSTACTION(m);
      if (newp != 0) {
        check_inuse_chunk(m, newp);
        mem = chunk2mem(newp);
      }
      else {
        mem = internal_malloc(m, bytes);
        if (mem != 0) {
          size_t oc = chunksize(oldp) - overhead_for(oldp);
          memcpy(mem, oldmem, (oc < bytes)? oc : bytes);
          internal_free(m, oldmem);
        }
      }
    }
  }
  return mem;
}